

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O1

void __thiscall cmStringReplaceHelper::ParseReplaceExpression(cmStringReplaceHelper *this)

{
  string *psVar1;
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  *this_00;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  ostream *poVar6;
  char (*__args) [2];
  size_type sVar7;
  ostringstream error;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  psVar1 = &this->ReplaceExpression;
  this_00 = &this->Replacements;
  sVar7 = 0;
  do {
    if ((this->ReplaceExpression)._M_string_length <= sVar7) {
      return;
    }
    uVar5 = std::__cxx11::string::find((char)psVar1,0x5c);
    if (uVar5 == 0xffffffffffffffff) {
      sVar7 = (this->ReplaceExpression)._M_string_length;
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar1);
      std::
      vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
      ::emplace_back<std::__cxx11::string>
                ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1
                       );
      }
LAB_0025aa3b:
      bVar4 = true;
    }
    else {
      if (uVar5 != sVar7) {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar1);
        std::
        vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                          local_1a8._16_8_ + 1);
        }
      }
      if (uVar5 != (this->ReplaceExpression)._M_string_length - 1) {
        pcVar3 = (psVar1->_M_dataplus)._M_p;
        cVar2 = pcVar3[uVar5 + 1];
        if ((byte)(cVar2 - 0x30U) < 10) {
          local_1a8._0_4_ = pcVar3[uVar5 + 1] + -0x30;
          std::
          vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
          ::emplace_back<int>(this_00,(int *)local_1a8);
        }
        else {
          if (cVar2 == '\\') {
            __args = (char (*) [2])0x53907d;
          }
          else {
            if (cVar2 != 'n') {
              this->ValidReplaceExpression = false;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unknown escape \"",0x10);
              std::__cxx11::string::substr((ulong)&local_1c8,(ulong)psVar1);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,"\" in replace-expression",0x17);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)this,(string *)&local_1c8);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_0025a994;
            }
            __args = (char (*) [2])0x572789;
          }
          std::
          vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
          ::emplace_back<char_const(&)[2]>
                    ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                      *)this_00,__args);
        }
        sVar7 = uVar5 + 2;
        goto LAB_0025aa3b;
      }
      this->ValidReplaceExpression = false;
      std::__cxx11::string::_M_replace
                ((ulong)this,0,(char *)(this->ErrorString)._M_string_length,0x531864);
LAB_0025a994:
      bVar4 = false;
    }
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void cmStringReplaceHelper::ParseReplaceExpression()
{
  std::string::size_type l = 0;
  while (l < this->ReplaceExpression.length()) {
    auto r = this->ReplaceExpression.find('\\', l);
    if (r == std::string::npos) {
      r = this->ReplaceExpression.length();
      this->Replacements.emplace_back(
        this->ReplaceExpression.substr(l, r - l));
    } else {
      if (r - l > 0) {
        this->Replacements.emplace_back(
          this->ReplaceExpression.substr(l, r - l));
      }
      if (r == (this->ReplaceExpression.length() - 1)) {
        this->ValidReplaceExpression = false;
        this->ErrorString = "replace-expression ends in a backslash";
        return;
      }
      if ((this->ReplaceExpression[r + 1] >= '0') &&
          (this->ReplaceExpression[r + 1] <= '9')) {
        this->Replacements.emplace_back(this->ReplaceExpression[r + 1] - '0');
      } else if (this->ReplaceExpression[r + 1] == 'n') {
        this->Replacements.emplace_back("\n");
      } else if (this->ReplaceExpression[r + 1] == '\\') {
        this->Replacements.emplace_back("\\");
      } else {
        this->ValidReplaceExpression = false;
        std::ostringstream error;
        error << "Unknown escape \"" << this->ReplaceExpression.substr(r, 2)
              << "\" in replace-expression";
        this->ErrorString = error.str();
        return;
      }
      r += 2;
    }
    l = r;
  }
}